

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::analyze_literal
          (Internal *this,int lit,int *open,int *resolvent_size,int *antecedent_size)

{
  uint uVar1;
  Var *pVVar2;
  Flags *pFVar3;
  Clause *pCVar4;
  uint64_t *puVar5;
  reference pvVar6;
  int *in_RCX;
  int *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  int *in_R8;
  Level *l;
  uint64_t id_1;
  uint uidx_1;
  uint64_t id;
  uint uidx;
  Flags *f;
  Var *v;
  int iVar7;
  Internal *in_stack_ffffffffffffffa0;
  value_type_conflict5 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar7 = (int)((ulong)in_RDI >> 0x20);
  pVVar2 = var(in_stack_ffffffffffffffa0,iVar7);
  pFVar3 = flags(in_stack_ffffffffffffffa0,iVar7);
  if (pVVar2->level == 0) {
    if ((((uint)*pFVar3 & 1) == 0) && ((*(byte *)(in_RDI + 0x140) & 1) != 0)) {
      *pFVar3 = (Flags)((uint)*pFVar3 & 0xfffffffe | 1);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      vlit(in_stack_ffffffffffffffa0,iVar7);
      unit_clauses(in_stack_ffffffffffffffa0,iVar7);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
  }
  else {
    *in_R8 = *in_R8 + 1;
    if (((uint)*pFVar3 & 1) == 0) {
      if (pVVar2->reason == *(Clause **)(in_RDI + 0x3d0)) {
        pCVar4 = learn_external_reason_clause
                           ((Internal *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            (int)((ulong)in_RDX >> 0x20),(int)in_RDX,SUB81((ulong)in_RCX >> 0x38,0))
        ;
        pVVar2->reason = pCVar4;
        if (pVVar2->reason == (Clause *)0x0) {
          *in_R8 = *in_R8 + -1;
          if (((uint)*pFVar3 & 1) != 0) {
            return;
          }
          if ((*(byte *)(in_RDI + 0x140) & 1) == 0) {
            return;
          }
          *pFVar3 = (Flags)((uint)*pFVar3 & 0xfffffffe | 1);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (value_type_conflict3 *)in_stack_ffffffffffffffa8);
          uVar1 = vlit(in_stack_ffffffffffffffa0,iVar7);
          puVar5 = unit_clauses(in_stack_ffffffffffffffa0,iVar7);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     CONCAT44(uVar1,in_stack_ffffffffffffffb0),(value_type_conflict5 *)*puVar5);
          return;
        }
      }
      *pFVar3 = (Flags)((uint)*pFVar3 & 0xfffffffe | 1);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      if (pVVar2->level < *(int *)(in_RDI + 0x144)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      }
      pvVar6 = std::vector<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_>::operator[]
                         ((vector<CaDiCaL::Level,_std::allocator<CaDiCaL::Level>_> *)
                          (in_RDI + 0x888),(long)pVVar2->level);
      iVar7 = (pvVar6->seen).count;
      (pvVar6->seen).count = iVar7 + 1;
      if (iVar7 == 0) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   (value_type_conflict3 *)in_stack_ffffffffffffffa8);
      }
      if (pVVar2->trail < (pvVar6->seen).trail) {
        (pvVar6->seen).trail = pVVar2->trail;
      }
      *in_RCX = *in_RCX + 1;
      if (pVVar2->level == *(int *)(in_RDI + 0x144)) {
        *in_RDX = *in_RDX + 1;
      }
    }
  }
  return;
}

Assistant:

inline void Internal::analyze_literal (int lit, int &open,
                                       int &resolvent_size,
                                       int &antecedent_size) {
  assert (lit);
  Var &v = var (lit);
  Flags &f = flags (lit);

  if (!v.level) {
    if (f.seen || !lrat)
      return;
    f.seen = true;
    unit_analyzed.push_back (lit);
    assert (val (lit) < 0);
    const unsigned uidx = vlit (-lit);
    uint64_t id = unit_clauses (uidx);
    assert (id);
    unit_chain.push_back (id);
    return;
  }
  ++antecedent_size;
  if (f.seen)
    return;

  // before marking as seen, get reason and check for missed unit

  assert (val (lit) < 0);
  assert (v.level <= level);
  if (v.reason == external_reason) {
    assert (!opts.exteagerreasons);
    v.reason = learn_external_reason_clause (-lit, 0, true);
    if (!v.reason) { // actually a unit
      --antecedent_size;
      LOG ("%d unit after explanation", -lit);
      if (f.seen || !lrat)
        return;
      f.seen = true;
      unit_analyzed.push_back (lit);
      assert (val (lit) < 0);
      const unsigned uidx = vlit (-lit);
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      return;
    }
  }

  f.seen = true;
  analyzed.push_back (lit);

  assert (v.reason != external_reason);
  if (v.level < level)
    clause.push_back (lit);
  Level &l = control[v.level];
  if (!l.seen.count++) {
    LOG ("found new level %d contributing to conflict", v.level);
    levels.push_back (v.level);
  }
  if (v.trail < l.seen.trail)
    l.seen.trail = v.trail;
  ++resolvent_size;
  LOG ("analyzed literal %d assigned at level %d", lit, v.level);
  if (v.level == level)
    open++;
}